

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::MultiSampleLineRasterizer::MultiSampleLineRasterizer
          (MultiSampleLineRasterizer *this,int numSamples,IVec4 *viewport)

{
  int iVar1;
  IVec4 *viewport_00;
  RasterizationState local_40;
  RasterizationState local_30;
  IVec4 *local_20;
  IVec4 *viewport_local;
  MultiSampleLineRasterizer *pMStack_10;
  int numSamples_local;
  MultiSampleLineRasterizer *this_local;
  
  this->m_numSamples = numSamples;
  iVar1 = this->m_numSamples;
  local_20 = viewport;
  viewport_local._4_4_ = numSamples;
  pMStack_10 = this;
  RasterizationState::RasterizationState(&local_30);
  TriangleRasterizer::TriangleRasterizer(&this->m_triangleRasterizer0,viewport,iVar1,&local_30);
  viewport_00 = local_20;
  iVar1 = this->m_numSamples;
  RasterizationState::RasterizationState(&local_40);
  TriangleRasterizer::TriangleRasterizer(&this->m_triangleRasterizer1,viewport_00,iVar1,&local_40);
  return;
}

Assistant:

MultiSampleLineRasterizer::MultiSampleLineRasterizer (const int numSamples, const tcu::IVec4& viewport)
	: m_numSamples			(numSamples)
	, m_triangleRasterizer0 (viewport, m_numSamples, RasterizationState())
	, m_triangleRasterizer1 (viewport, m_numSamples, RasterizationState())
{
}